

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicState1::Run(BasicState1 *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  GLuint i;
  int iVar4;
  bool bVar5;
  bool bVar6;
  GLint p;
  VertexBindingState vb0;
  VertexAttribState va2;
  VertexBindingState vb2;
  VertexAttribState va0;
  VertexBindingState vb15;
  VertexAttribState va15;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,10000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,10000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[2]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,10000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x82da,&p);
  bVar3 = 0xf < p;
  if (!bVar3) {
    anon_unknown_0::Output("GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n");
  }
  glu::CallLogWrapper::glGetIntegerv(this_00,0x82d9,&p);
  bVar2 = 0x7fe < p;
  if (!bVar2) {
    anon_unknown_0::Output
              ("GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n");
  }
  glu::CallLogWrapper::glGetIntegerv(this_00,0x82e5,&p);
  bVar1 = 0x7ff < p;
  if (!bVar1) {
    anon_unknown_0::Output("GL_MAX_VERTEX_ATTRIB_STRIDE is %d but must be at least 2048.\n");
  }
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8895,&p);
  bVar6 = p == 0;
  if (!bVar6) {
    anon_unknown_0::Output("GL_ELEMENT_ARRAY_BUFFER_BINDING is %d should be %d.\n",(ulong)(uint)p,0)
    ;
  }
  bVar5 = bVar6 && (bVar1 && (bVar2 && bVar3));
  bVar3 = bVar6 && (bVar1 && (bVar2 && bVar3));
  for (iVar4 = 0; iVar4 != 0x10; iVar4 = iVar4 + 1) {
    VertexAttribState::VertexAttribState(&va0,iVar4);
    bVar2 = VertexAttribState::stateVerify(&va0);
    bVar5 = bVar3;
    if (!bVar2) {
      bVar5 = false;
    }
    glu::CallLogWrapper::~CallLogWrapper(&va0.super_GLWrapper.super_CallLogWrapper);
    bVar3 = bVar5;
  }
  for (iVar4 = 0; iVar4 != 0x10; iVar4 = iVar4 + 1) {
    VertexBindingState::VertexBindingState((VertexBindingState *)&va0,iVar4);
    bVar3 = VertexBindingState::stateVerify((VertexBindingState *)&va0);
    if (!bVar3) {
      bVar5 = false;
    }
    glu::CallLogWrapper::~CallLogWrapper(&va0.super_GLWrapper.super_CallLogWrapper);
  }
  if (!bVar5) {
    bVar5 = false;
    anon_unknown_0::Output("Default state check failed.\n");
  }
  VertexAttribState::VertexAttribState(&va0,0);
  va0.array_size = 2;
  va0.array_type = 0x1400;
  va0.array_normalized = 1;
  va0.relative_offset = 0x10;
  VertexBindingState::VertexBindingState(&vb0,0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1400,'\x01',0x10);
  bVar3 = VertexAttribState::stateVerify(&va0);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb0);
    if (!bVar3) goto LAB_00c1cce6;
  }
  else {
LAB_00c1cce6:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribFormat state change check failed.\n");
  }
  VertexAttribState::VertexAttribState(&va2,2);
  va2.array_size = 3;
  va2.array_type = 0x1404;
  va2.array_integer = 1;
  va2.relative_offset = 0x200;
  VertexBindingState::VertexBindingState(&vb2,2);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,2,3,0x1404,0x200);
  bVar3 = VertexAttribState::stateVerify(&va2);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb2);
    if (!bVar3) goto LAB_00c1cd78;
  }
  else {
LAB_00c1cd78:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribIFormat state change check failed.\n");
  }
  vb0.buffer = this->m_vbo[0];
  vb0.offset = 0x800;
  vb0.stride = 0x80;
  va0.array_buffer_binding = vb0.buffer;
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,vb0.buffer,0x800,0x80);
  bVar3 = VertexAttribState::stateVerify(&va0);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb0);
    if (!bVar3) goto LAB_00c1cddc;
  }
  else {
LAB_00c1cddc:
    bVar5 = false;
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
  }
  va2.array_buffer_binding = this->m_vbo[2];
  vb2.offset = 0x40;
  vb2.stride = 0x100;
  vb2.buffer = va2.array_buffer_binding;
  glu::CallLogWrapper::glBindVertexBuffer(this_00,2,va2.array_buffer_binding,0x40,0x100);
  bVar3 = VertexAttribState::stateVerify(&va2);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb2);
    if (!bVar3) goto LAB_00c1ce48;
  }
  else {
LAB_00c1ce48:
    bVar5 = false;
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
  }
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,0);
  va2.binding = 0;
  va2.array_buffer_binding = this->m_vbo[0];
  bVar3 = VertexAttribState::stateVerify(&va0);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb0);
    if (!bVar3) goto LAB_00c1ceb6;
    bVar3 = VertexAttribState::stateVerify(&va2);
    if (!bVar3) goto LAB_00c1ceb6;
    bVar3 = VertexBindingState::stateVerify(&vb2);
    if (!bVar3) goto LAB_00c1ceb6;
  }
  else {
LAB_00c1ceb6:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribBinding state change check failed.\n");
  }
  VertexAttribState::VertexAttribState(&va15,0xf);
  VertexBindingState::VertexBindingState(&vb15,0xf);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0xf);
  va0.array_buffer_binding = 0;
  va0.binding = 0xf;
  bVar3 = VertexAttribState::stateVerify(&va0);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb0);
    if (!bVar3) goto LAB_00c1cf43;
    bVar3 = VertexAttribState::stateVerify(&va15);
    if (!bVar3) goto LAB_00c1cf43;
    bVar3 = VertexBindingState::stateVerify(&vb15);
    if (!bVar3) goto LAB_00c1cf43;
  }
  else {
LAB_00c1cf43:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribBinding state change check failed.\n");
  }
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0xf,this->m_vbo[1],0x10,0x20);
  va0.array_buffer_binding = this->m_vbo[1];
  vb15.offset = 0x10;
  vb15.stride = 0x20;
  vb15.buffer = va0.array_buffer_binding;
  va15.array_buffer_binding = va0.array_buffer_binding;
  bVar3 = VertexAttribState::stateVerify(&va0);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb0);
    if (!bVar3) goto LAB_00c1cfd5;
    bVar3 = VertexAttribState::stateVerify(&va15);
    if (!bVar3) goto LAB_00c1cfd5;
    bVar3 = VertexBindingState::stateVerify(&vb15);
    if (!bVar3) goto LAB_00c1cfd5;
  }
  else {
LAB_00c1cfd5:
    bVar5 = false;
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
  }
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0xf,1,0x140b,'\0',0x400);
  va15.array_size = 1;
  va15.array_type = 0x140b;
  va15.relative_offset = 0x400;
  bVar3 = VertexAttribState::stateVerify(&va0);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb0);
    if (!bVar3) goto LAB_00c1d083;
    bVar3 = VertexAttribState::stateVerify(&va2);
    if (!bVar3) goto LAB_00c1d083;
    bVar3 = VertexBindingState::stateVerify(&vb2);
    if (!bVar3) goto LAB_00c1d083;
    bVar3 = VertexAttribState::stateVerify(&va15);
    if (!bVar3) goto LAB_00c1d083;
    bVar3 = VertexBindingState::stateVerify(&vb15);
    if (!bVar3) goto LAB_00c1d083;
  }
  else {
LAB_00c1d083:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribFormat state change check failed.\n");
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[2]);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1401,'\0',8,(void *)0x280);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  va0.array_size = 4;
  va0.array_stride = 8;
  va0.array_type = 0x1401;
  va0.array_normalized = 0;
  va0.array_pointer = 0x280;
  va0.binding = 0;
  va0.relative_offset = 0;
  vb0.buffer = this->m_vbo[2];
  vb0.offset = 0x280;
  vb0.stride = 8;
  va2.array_buffer_binding = vb0.buffer;
  va0.array_buffer_binding = vb0.buffer;
  bVar3 = VertexAttribState::stateVerify(&va0);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb0);
    if (!bVar3) goto LAB_00c1d176;
    bVar3 = VertexAttribState::stateVerify(&va2);
    if (!bVar3) goto LAB_00c1d176;
    bVar3 = VertexBindingState::stateVerify(&vb2);
    if (!bVar3) goto LAB_00c1d176;
    bVar3 = VertexAttribState::stateVerify(&va15);
    if (!bVar3) goto LAB_00c1d176;
    bVar3 = VertexBindingState::stateVerify(&vb15);
    if (!bVar3) goto LAB_00c1d176;
  }
  else {
LAB_00c1d176:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribPointer state change check failed.\n");
  }
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[1],0x50,0x18);
  vb0.buffer = this->m_vbo[1];
  vb0.offset = 0x50;
  vb0.stride = 0x18;
  va2.array_buffer_binding = vb0.buffer;
  va0.array_buffer_binding = vb0.buffer;
  bVar3 = VertexAttribState::stateVerify(&va0);
  if (bVar3) {
    bVar3 = VertexBindingState::stateVerify(&vb0);
    if (bVar3) {
      bVar3 = VertexAttribState::stateVerify(&va2);
      if (bVar3) {
        bVar3 = VertexBindingState::stateVerify(&vb2);
        if (bVar3) {
          bVar3 = VertexAttribState::stateVerify(&va15);
          if (bVar3) {
            bVar3 = VertexBindingState::stateVerify(&vb15);
            if (bVar3) goto LAB_00c1d22e;
          }
        }
      }
    }
  }
  bVar5 = false;
  anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
LAB_00c1d22e:
  glu::CallLogWrapper::~CallLogWrapper(&vb15.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&va15.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&vb2.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&va2.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&vb0.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&va0.super_GLWrapper.super_CallLogWrapper);
  return -(ulong)(byte)~bVar5;
}

Assistant:

virtual long Run()
	{
		bool status = true;
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, 10000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, 10000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[2]);
		glBufferData(GL_ARRAY_BUFFER, 10000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		if (p < 16)
		{
			Output("GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n", p);
			status = false;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p < 2047)
		{
			Output("GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n", p);
			status = false;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_STRIDE, &p);
		if (p < 2048)
		{
			Output("GL_MAX_VERTEX_ATTRIB_STRIDE is %d but must be at least 2048.\n", p);
			status = false;
		}

		glBindVertexArray(m_vao);
		// check default state
		glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &p);
		if (0 != p)
		{
			Output("GL_ELEMENT_ARRAY_BUFFER_BINDING is %d should be %d.\n", p, 0);
			status = false;
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			VertexAttribState va(i);
			if (!va.stateVerify())
				status = false;
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			VertexBindingState vb(i);
			if (!vb.stateVerify())
				status = false;
		}
		if (!status)
		{
			Output("Default state check failed.\n");
			status = false;
		}

		VertexAttribState va0(0);
		va0.array_size		 = 2;
		va0.array_type		 = GL_BYTE;
		va0.array_normalized = 1;
		va0.relative_offset  = 16;
		VertexBindingState vb0(0);
		glVertexAttribFormat(0, 2, GL_BYTE, GL_TRUE, 16);
		if (!va0.stateVerify() || !vb0.stateVerify())
		{
			Output("glVertexAttribFormat state change check failed.\n");
			status = false;
		}

		VertexAttribState va2(2);
		va2.array_size		= 3;
		va2.array_type		= GL_INT;
		va2.array_integer   = 1;
		va2.relative_offset = 512;
		VertexBindingState vb2(2);
		glVertexAttribIFormat(2, 3, GL_INT, 512);
		if (!va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribIFormat state change check failed.\n");
			status = false;
		}

		va0.array_buffer_binding = m_vbo[0];
		vb0.buffer				 = m_vbo[0];
		vb0.offset				 = 2048;
		vb0.stride				 = 128;
		glBindVertexBuffer(0, m_vbo[0], 2048, 128);
		if (!va0.stateVerify() || !vb0.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		va2.array_buffer_binding = m_vbo[2];
		vb2.buffer				 = m_vbo[2];
		vb2.offset				 = 64;
		vb2.stride				 = 256;
		glBindVertexBuffer(2, m_vbo[2], 64, 256);
		if (!va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		glVertexAttribBinding(2, 0);
		va2.binding				 = 0;
		va2.array_buffer_binding = m_vbo[0];
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribBinding state change check failed.\n");
			status = false;
		}

		VertexAttribState  va15(15);
		VertexBindingState vb15(15);
		glVertexAttribBinding(0, 15);
		va0.binding				 = 15;
		va0.array_buffer_binding = 0;
		if (!va0.stateVerify() || !vb0.stateVerify() || !va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glVertexAttribBinding state change check failed.\n");
			status = false;
		}

		glBindVertexBuffer(15, m_vbo[1], 16, 32);
		va0.array_buffer_binding  = m_vbo[1];
		va15.array_buffer_binding = m_vbo[1];
		vb15.buffer				  = m_vbo[1];
		vb15.offset				  = 16;
		vb15.stride				  = 32;
		if (!va0.stateVerify() || !vb0.stateVerify() || !va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		glVertexAttribFormat(15, 1, GL_HALF_FLOAT, GL_FALSE, 1024);
		va15.array_size		 = 1;
		va15.array_type		 = GL_HALF_FLOAT;
		va15.relative_offset = 1024;
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify() ||
			!va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glVertexAttribFormat state change check failed.\n");
			status = false;
		}

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[2]);
		glVertexAttribPointer(0, 4, GL_UNSIGNED_BYTE, GL_FALSE, 8, (void*)640);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		va0.array_size			 = 4;
		va0.array_type			 = GL_UNSIGNED_BYTE;
		va0.array_stride		 = 8;
		va0.array_pointer		 = 640;
		va0.relative_offset		 = 0;
		va0.array_normalized	 = 0;
		va0.binding				 = 0;
		va0.array_buffer_binding = m_vbo[2];
		vb0.buffer				 = m_vbo[2];
		vb0.offset				 = 640;
		vb0.stride				 = 8;
		va2.array_buffer_binding = m_vbo[2];
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify() ||
			!va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glVertexAttribPointer state change check failed.\n");
			status = false;
		}

		glBindVertexBuffer(0, m_vbo[1], 80, 24);
		vb0.buffer				 = m_vbo[1];
		vb0.offset				 = 80;
		vb0.stride				 = 24;
		va2.array_buffer_binding = m_vbo[1];
		va0.array_buffer_binding = m_vbo[1];
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify() ||
			!va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}